

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O1

void vkt::BindingModel::anon_unknown_1::BufferRenderInstance::writeDescriptorSetWithTemplate
               (DeviceInterface *vki,VkDevice device,VkDescriptorSetLayout layout,
               VkDescriptorPool descriptorPool,VkDescriptorType descriptorType,
               ShaderInputInterface shaderInterface,VkBuffer bufferA,deUint32 offsetA,
               VkBuffer bufferB,deUint32 offsetB,VkDescriptorSet descriptorSet,
               Move<vk::Handle<(vk::HandleType)32>_> *updateTemplate,
               RawUpdateRegistry *updateRegistry,bool withPush,VkPipelineLayout pipelineLayout)

{
  VkDescriptorType VVar1;
  undefined4 in_register_0000008c;
  undefined4 in_stack_00000014;
  undefined4 in_stack_00000024;
  undefined7 in_stack_00000041;
  VkDescriptorBufferInfo bufferInfos [2];
  undefined1 local_118 [12];
  VkDescriptorType VStack_10c;
  VkDevice local_108;
  VkAllocationCallbacks *pVStack_100;
  VkDescriptorUpdateTemplateEntryKHR *local_f8;
  iterator iStack_f0;
  VkDescriptorUpdateTemplateEntryKHR *local_e8;
  Move<vk::Handle<(vk::HandleType)32>_> local_d8;
  VkDescriptorUpdateTemplateCreateInfoKHR local_b0;
  VkDescriptorBufferInfo local_68;
  VkDescriptorBufferInfo local_50;
  
  local_50.offset = bufferB.m_internal & 0xffffffff;
  local_68.offset = bufferA.m_internal & 0xffffffff;
  local_b0.pipelineLayout.m_internal = CONCAT71(in_stack_00000041,withPush);
  local_50.buffer.m_internal = CONCAT44(in_stack_00000014,offsetA);
  local_68.buffer.m_internal = CONCAT44(in_register_0000008c,shaderInterface);
  local_68.range = 0x20;
  local_50.range = 0x20;
  local_e8 = (VkDescriptorUpdateTemplateEntryKHR *)0x0;
  local_f8 = (VkDescriptorUpdateTemplateEntryKHR *)0x0;
  iStack_f0._M_current = (VkDescriptorUpdateTemplateEntryKHR *)0x0;
  local_b0.sType = VK_STRUCTURE_TYPE_DESCRIPTOR_UPDATE_TEMPLATE_CREATE_INFO_KHR;
  local_b0.pNext = (void *)0x0;
  local_b0.flags = 0;
  local_b0.descriptorUpdateEntryCount = 0;
  local_b0.pDescriptorUpdateEntries = (VkDescriptorUpdateTemplateEntryKHR *)0x0;
  local_b0.templateType = (VkDescriptorUpdateTemplateTypeKHR)(byte)updateRegistry;
  local_b0.pipelineBindPoint = VK_PIPELINE_BIND_POINT_GRAPHICS;
  local_b0.set = 0;
  local_b0.descriptorSetLayout.m_internal = layout.m_internal;
  RawUpdateRegistry::addWriteObject<vk::VkDescriptorBufferInfo>
            ((RawUpdateRegistry *)updateTemplate,&local_68);
  RawUpdateRegistry::addWriteObject<vk::VkDescriptorBufferInfo>
            ((RawUpdateRegistry *)updateTemplate,&local_50);
  VVar1 = (VkDescriptorType)descriptorPool.m_internal;
  if (descriptorType == VK_DESCRIPTOR_TYPE_SAMPLER) {
    local_108 = (VkDevice)
                ((updateTemplate->super_RefBase<vk::Handle<(vk::HandleType)32>_>).m_data.deleter.
                m_allocator)->pUserData;
    local_118._0_4_ = 0;
    local_118._4_4_ = 0;
    VStack_10c = VVar1;
    local_118._8_4_ = 1;
    pVStack_100 = (VkAllocationCallbacks *)0x0;
    if (iStack_f0._M_current == local_e8) {
      std::
      vector<vk::VkDescriptorUpdateTemplateEntryKHR,std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>>
      ::_M_realloc_insert<vk::VkDescriptorUpdateTemplateEntryKHR_const&>
                ((vector<vk::VkDescriptorUpdateTemplateEntryKHR,std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>>
                  *)&local_f8,iStack_f0,(VkDescriptorUpdateTemplateEntryKHR *)local_118);
      goto LAB_00531035;
    }
  }
  else if (descriptorType == VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER) {
    local_108 = (VkDevice)
                ((updateTemplate->super_RefBase<vk::Handle<(vk::HandleType)32>_>).m_data.deleter.
                m_allocator)->pUserData;
    local_118._0_4_ = 0;
    local_118._4_4_ = 0;
    VStack_10c = VVar1;
    local_118._8_4_ = 1;
    pVStack_100 = (VkAllocationCallbacks *)0x0;
    if (iStack_f0._M_current == local_e8) {
      std::
      vector<vk::VkDescriptorUpdateTemplateEntryKHR,std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>>
      ::_M_realloc_insert<vk::VkDescriptorUpdateTemplateEntryKHR_const&>
                ((vector<vk::VkDescriptorUpdateTemplateEntryKHR,std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>>
                  *)&local_f8,iStack_f0,(VkDescriptorUpdateTemplateEntryKHR *)local_118);
    }
    else {
      (iStack_f0._M_current)->offset = (deUintptr)local_108;
      (iStack_f0._M_current)->stride = 0;
      (iStack_f0._M_current)->dstBinding = 0;
      (iStack_f0._M_current)->dstArrayElement = 0;
      (iStack_f0._M_current)->descriptorCount = 1;
      (iStack_f0._M_current)->descriptorType = VVar1;
      iStack_f0._M_current = iStack_f0._M_current + 1;
    }
    local_108 = (VkDevice)
                ((updateTemplate->super_RefBase<vk::Handle<(vk::HandleType)32>_>).m_data.deleter.
                m_allocator)->pfnAllocation;
    local_118._0_4_ = 1;
    local_118._4_4_ = 0;
    local_118._8_4_ = 1;
    pVStack_100 = (VkAllocationCallbacks *)0x0;
    if (iStack_f0._M_current == local_e8) {
      std::
      vector<vk::VkDescriptorUpdateTemplateEntryKHR,std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>>
      ::_M_realloc_insert<vk::VkDescriptorUpdateTemplateEntryKHR_const&>
                ((vector<vk::VkDescriptorUpdateTemplateEntryKHR,std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>>
                  *)&local_f8,iStack_f0,(VkDescriptorUpdateTemplateEntryKHR *)local_118);
      goto LAB_00531035;
    }
  }
  else {
    if (descriptorType != VK_DESCRIPTOR_TYPE_STORAGE_IMAGE) goto LAB_00531035;
    local_108 = (VkDevice)
                ((updateTemplate->super_RefBase<vk::Handle<(vk::HandleType)32>_>).m_data.deleter.
                m_allocator)->pUserData;
    local_118._0_4_ = 0;
    local_118._4_4_ = 0;
    VStack_10c = VVar1;
    local_118._8_4_ = 2;
    pVStack_100 = (VkAllocationCallbacks *)0x18;
    if (iStack_f0._M_current == local_e8) {
      std::
      vector<vk::VkDescriptorUpdateTemplateEntryKHR,std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>>
      ::_M_realloc_insert<vk::VkDescriptorUpdateTemplateEntryKHR_const&>
                ((vector<vk::VkDescriptorUpdateTemplateEntryKHR,std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>>
                  *)&local_f8,iStack_f0,(VkDescriptorUpdateTemplateEntryKHR *)local_118);
      goto LAB_00531035;
    }
  }
  (iStack_f0._M_current)->offset = (deUintptr)local_108;
  (iStack_f0._M_current)->stride = (deUintptr)pVStack_100;
  (iStack_f0._M_current)->dstBinding = local_118._0_4_;
  (iStack_f0._M_current)->dstArrayElement = local_118._4_4_;
  (iStack_f0._M_current)->descriptorCount = local_118._8_4_;
  (iStack_f0._M_current)->descriptorType = VStack_10c;
  iStack_f0._M_current = iStack_f0._M_current + 1;
LAB_00531035:
  local_b0.pDescriptorUpdateEntries = local_f8;
  local_b0.descriptorUpdateEntryCount =
       (deUint32)((ulong)((long)iStack_f0._M_current - (long)local_f8) >> 5);
  ::vk::createDescriptorUpdateTemplateKHR
            (&local_d8,vki,device,&local_b0,(VkAllocationCallbacks *)0x0);
  local_108 = local_d8.super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.deleter.m_device;
  pVStack_100 = local_d8.super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.deleter.m_allocator;
  local_118._0_8_ = local_d8.super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.object.m_internal
  ;
  stack0xfffffffffffffef0 =
       local_d8.super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.deleter.m_deviceIface;
  local_d8.super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.object.m_internal = 0;
  local_d8.super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_d8.super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_d8.super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  if (*descriptorSet.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)32>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)32>_> *)(descriptorSet.m_internal + 8),
               (VkDescriptorUpdateTemplateKHR)*descriptorSet.m_internal);
  }
  *(VkDevice *)(descriptorSet.m_internal + 0x10) = local_108;
  *(VkAllocationCallbacks **)(descriptorSet.m_internal + 0x18) = pVStack_100;
  *(undefined4 *)descriptorSet.m_internal = local_118._0_4_;
  *(undefined4 *)(descriptorSet.m_internal + 4) = local_118._4_4_;
  *(undefined4 *)(descriptorSet.m_internal + 8) = local_118._8_4_;
  *(VkDescriptorType *)(descriptorSet.m_internal + 0xc) = VStack_10c;
  if (local_d8.super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)32>_>::operator()
              (&local_d8.super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.deleter,
               (VkDescriptorUpdateTemplateKHR)
               local_d8.super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.object.m_internal);
  }
  if ((byte)updateRegistry == 0) {
    (*vki->_vptr_DeviceInterface[0x92])
              (vki,device,CONCAT44(in_stack_00000024,offsetB),
               *(undefined8 *)descriptorSet.m_internal,
               (updateTemplate->super_RefBase<vk::Handle<(vk::HandleType)32>_>).m_data.object.
               m_internal);
  }
  if (local_f8 != (VkDescriptorUpdateTemplateEntryKHR *)0x0) {
    operator_delete(local_f8,(long)local_e8 - (long)local_f8);
  }
  return;
}

Assistant:

void BufferRenderInstance::writeDescriptorSetWithTemplate (const vk::DeviceInterface&						vki,
														   vk::VkDevice										device,
														   vk::VkDescriptorSetLayout						layout,
														   vk::VkDescriptorPool								descriptorPool,
														   vk::VkDescriptorType								descriptorType,
														   ShaderInputInterface								shaderInterface,
														   vk::VkBuffer										bufferA,
														   const deUint32									offsetA,
														   vk::VkBuffer										bufferB,
														   const deUint32									offsetB,
														   vk::VkDescriptorSet								descriptorSet,
														   vk::Move<vk::VkDescriptorUpdateTemplateKHR>&		updateTemplate,
														   RawUpdateRegistry&								updateRegistry,
														   bool												withPush,
														   vk::VkPipelineLayout								pipelineLayout)
{
	DE_UNREF(descriptorPool);
	const vk::VkDescriptorBufferInfo						bufferInfos[2]	=
	{
		vk::makeDescriptorBufferInfo(bufferA, (vk::VkDeviceSize)offsetA, (vk::VkDeviceSize)BUFFER_DATA_SIZE),
		vk::makeDescriptorBufferInfo(bufferB, (vk::VkDeviceSize)offsetB, (vk::VkDeviceSize)BUFFER_DATA_SIZE),
	};
	std::vector<vk::VkDescriptorUpdateTemplateEntryKHR>		updateEntries;
	vk::VkDescriptorUpdateTemplateCreateInfoKHR				templateCreateInfo	=
	{
		vk::VK_STRUCTURE_TYPE_DESCRIPTOR_UPDATE_TEMPLATE_CREATE_INFO_KHR,
		DE_NULL,
		0,
		0,			// descriptorUpdateEntryCount
		DE_NULL,	// pDescriptorUpdateEntries
		withPush ? vk::VK_DESCRIPTOR_UPDATE_TEMPLATE_TYPE_PUSH_DESCRIPTORS_KHR : vk::VK_DESCRIPTOR_UPDATE_TEMPLATE_TYPE_DESCRIPTOR_SET_KHR,
		layout,
		vk::VK_PIPELINE_BIND_POINT_GRAPHICS,
		pipelineLayout,
		0
	};
	updateRegistry.addWriteObject(bufferInfos[0]);
	updateRegistry.addWriteObject(bufferInfos[1]);

	switch (shaderInterface)
	{
		case SHADER_INPUT_SINGLE_DESCRIPTOR:
			updateEntries.push_back(createTemplateBinding(0u, 0, 1, descriptorType, updateRegistry.getWriteObjectOffset(0), 0));
			break;

		case SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS:
			updateEntries.push_back(createTemplateBinding(0u, 0, 1, descriptorType, updateRegistry.getWriteObjectOffset(0), 0));
			updateEntries.push_back(createTemplateBinding(1u, 0, 1, descriptorType, updateRegistry.getWriteObjectOffset(1), 0));
			break;

		case SHADER_INPUT_DESCRIPTOR_ARRAY:
			updateEntries.push_back(createTemplateBinding(0u, 0, 2, descriptorType, updateRegistry.getWriteObjectOffset(0), sizeof(bufferInfos[0])));
			break;

		default:
			DE_FATAL("Impossible");
	}

	templateCreateInfo.pDescriptorUpdateEntries			= &updateEntries[0];
	templateCreateInfo.descriptorUpdateEntryCount		= (deUint32)updateEntries.size();

	updateTemplate										= vk::createDescriptorUpdateTemplateKHR(vki, device, &templateCreateInfo);

	if (!withPush)
	{
		vki.updateDescriptorSetWithTemplateKHR(device, descriptorSet, *updateTemplate, updateRegistry.getRawPointer());
	}
}